

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgQuaternion.cpp
# Opt level: O1

dgQuaternion __thiscall dgQuaternion::Slerp(dgQuaternion *this,dgQuaternion *QB,HaF32 t)

{
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgQuaternion.cpp"
                ,0x8d,"dgQuaternion dgQuaternion::Slerp(const dgQuaternion &, hacd::HaF32) const");
}

Assistant:

dgQuaternion dgQuaternion::Slerp (const dgQuaternion &QB, hacd::HaF32 t) const 
{
HACD_ASSERT (0);
return dgQuaternion();
/*
	hacd::HaF32 dot;
	hacd::HaF32 ang;
	hacd::HaF32 Sclp;
	hacd::HaF32 Sclq;
	hacd::HaF32 den;
	hacd::HaF32 sinAng;
	dgQuaternion Q;

	dot = DotProduct (QB);

	if ((dot + hacd::HaF32(1.0f)) > dgEPSILON) {
		if (dot < (hacd::HaF32(1.0f) - dgEPSILON) ) {
			ang = dgAcos (dot);

			sinAng = dgSin (ang);
			den = hacd::HaF32(1.0f) / sinAng;

			Sclp = dgSin ((hacd::HaF32(1.0f) - t ) * ang) * den;
			Sclq = dgSin (t * ang) * den;

		} else  {
			Sclp = hacd::HaF32(1.0f) - t;
			Sclq = t;
		}

		Q.m_q0 = m_q0 * Sclp + QB.m_q0 * Sclq;
		Q.m_q1 = m_q1 * Sclp + QB.m_q1 * Sclq;
		Q.m_q2 = m_q2 * Sclp + QB.m_q2 * Sclq;
		Q.m_q3 = m_q3 * Sclp + QB.m_q3 * Sclq;

	} else {
		Q.m_q0 =  m_q3;
		Q.m_q1 = -m_q2;
		Q.m_q2 =  m_q1;
		Q.m_q3 =  m_q0;

		Sclp = dgSin ((hacd::HaF32(1.0f) - t) * dgPI * hacd::HaF32 (0.5f));
		Sclq = dgSin (t * dgPI * hacd::HaF32 (0.5f));

		Q.m_q0 = m_q0 * Sclp + Q.m_q0 * Sclq;
		Q.m_q1 = m_q1 * Sclp + Q.m_q1 * Sclq;
		Q.m_q2 = m_q2 * Sclp + Q.m_q2 * Sclq;
		Q.m_q3 = m_q3 * Sclp + Q.m_q3 * Sclq;
	}

	dot = Q.DotProduct (Q);
	if ((dot) < hacd::HaF32(1.0f - dgEPSILON * 10.0f) ) {
		//dot = hacd::HaF32(1.0f) / dgSqrt (dot);
		dot = dgRsqrt (dot);
		Q.m_q0 *= dot;
		Q.m_q1 *= dot;
		Q.m_q2 *= dot;
		Q.m_q3 *= dot;
	}
	return Q;
*/
}